

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O2

void __thiscall CGL::Application::mouse1_dragged(Application *this,float x,float y)

{
  ulong uVar1;
  Scene *this_00;
  ulong uVar2;
  Vector2D VVar3;
  float fVar4;
  float fVar5;
  bool bVar6;
  ostream *poVar7;
  char *this_01;
  undefined1 in_register_00001204 [60];
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Matrix4x4 local_98;
  
  auVar8._4_60_ = in_register_00001204;
  auVar8._0_4_ = x;
  if (this->mode == RENDER_MODE) {
    auVar9 = vinsertps_avx(auVar8._0_16_,ZEXT416((uint)((float)this->screenH - y)),0x10);
    VVar3 = (Vector2D)vcvtps2pd_avx(auVar9);
    this->renderer->cell_br = VVar3;
  }
  else {
    fVar4 = x - this->mouseX;
    fVar5 = y - this->mouseY;
    poVar7 = std::operator<<((ostream *)&std::cout,"dx, dy: ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar4);
    this_01 = ", ";
    poVar7 = std::operator<<(poVar7,", ");
    poVar7 = (ostream *)std::ostream::operator<<(poVar7,fVar5);
    std::endl<char,std::char_traits<char>>(poVar7);
    if ((this->mode != EDIT_MODE) || (bVar6 = GLScene::Scene::has_selection(this->scene), !bVar6)) {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = this->screenH;
      auVar9 = vunpcklps_avx(auVar9,ZEXT816(0x4530000043300000));
      auVar9 = vsubpd_avx(auVar9,_DAT_001cfb90);
      auVar10._8_8_ = 0;
      auVar10._0_8_ = this->screenW;
      auVar10 = vunpcklps_avx(auVar10,ZEXT816(0x4530000043300000));
      auVar10 = vsubpd_avx(auVar10,_DAT_001cfb90);
      CGL::Camera::rotate_by
                ((3.141592653589793 / (auVar9._0_8_ + auVar9._8_8_)) * (double)-fVar5,
                 (3.141592653589793 / (auVar10._0_8_ + auVar10._8_8_)) * (double)-fVar4);
      return;
    }
    uVar1 = this->screenW;
    this_00 = this->scene;
    uVar2 = this->screenH;
    get_world_to_3DH(&local_98,(Application *)this_01);
    GLScene::Scene::drag_selection
              (this_00,(fVar4 + fVar4) / (float)uVar1,(fVar5 * -2.0) / (float)uVar2,&local_98);
  }
  return;
}

Assistant:

void Application::mouse1_dragged(float x, float y) {
  if (mode == RENDER_MODE) {
    renderer->cell_br = Vector2D(x, screenH - y);
    return;
  }
  float dx = (x - mouseX);
  float dy = (y - mouseY);

  cout << "dx, dy: " << dx << ", " << dy << endl;

  if (mode == EDIT_MODE && scene->has_selection()) {
    scene->drag_selection(2 * dx / screenW, 2 * -dy / screenH,
                          get_world_to_3DH());
  } else {
    camera.rotate_by(-dy * (PI / screenH), -dx * (PI / screenW));
  }
}